

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trap.c
# Opt level: O0

_Bool square_remove_trap(chunk_conflict2 *c,loc_conflict grid,trap *trap,_Bool memorize)

{
  trap *trap_00;
  trap *ptVar1;
  _Bool _Var2;
  square_conflict *psVar3;
  bool bVar4;
  trap *next_trap;
  trap *ptStack_38;
  _Bool removed;
  trap *prev_trap;
  trap *cursor;
  _Bool memorize_local;
  trap *trap_local;
  chunk_conflict2 *c_local;
  loc_conflict grid_local;
  
  psVar3 = square((chunk *)c,grid);
  ptStack_38 = (trap *)0x0;
  ptVar1 = ptStack_38;
  prev_trap = psVar3->trap;
  do {
    ptStack_38 = ptVar1;
    if (prev_trap == (trap *)0x0) {
      return false;
    }
    trap_00 = trap->next;
    bVar4 = prev_trap != trap;
    ptVar1 = trap;
    prev_trap = trap_00;
  } while (bVar4);
  _Var2 = loc_eq((loc)grid,(loc)trap->grid);
  if (_Var2) {
    mem_free(trap);
    if (ptStack_38 == (trap *)0x0) {
      square_set_trap((chunk *)c,grid,trap_00);
      if (trap_00 == (trap *)0x0) {
        psVar3 = square((chunk *)c,grid);
        flag_off(psVar3->info,3,9);
      }
    }
    else {
      ptStack_38->next = trap_00;
    }
    if ((memorize) && (_Var2 = square_isseen((chunk *)cave,grid), _Var2)) {
      square_memorize_traps((chunk_conflict2 *)cave,grid);
      square_light_spot((chunk *)cave,(loc)grid);
    }
    return true;
  }
  __assert_fail("loc_eq(grid, trap->grid)",
                "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/trap.c"
                ,0x98,"_Bool square_remove_trap(struct chunk *, struct loc, struct trap *, _Bool)");
}

Assistant:

bool square_remove_trap(struct chunk *c, struct loc grid, struct trap *trap,
		bool memorize)
{
	struct trap *cursor = square(c, grid)->trap;
	struct trap *prev_trap = NULL;
	bool removed = false;

	while (cursor) {
		struct trap *next_trap = trap->next;

		if (cursor == trap) {
			assert(loc_eq(grid, trap->grid));
			removed = true;
			mem_free(trap);
			if (prev_trap) {
				prev_trap->next = next_trap;
			} else {
				square_set_trap(c, grid, next_trap);
				if (!next_trap) {
					/* There are no more traps here. */
					sqinfo_off(square(c, grid)->info,
						SQUARE_TRAP);
				}
			}
			/* Refresh grids that the character can see */
			if (memorize && square_isseen(cave, grid)) {
				square_memorize_traps(cave, grid);
				square_light_spot(cave, grid);
			}
			break;
		}
		prev_trap = trap;
		cursor = next_trap;
	}

	return removed;
}